

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-sve.c
# Opt level: O1

_Bool trans_CTERM(DisasContext_conflict1 *s,arg_CTERM *a)

{
  int iVar1;
  TCGContext_conflict1 *s_00;
  _Bool _Var2;
  undefined1 extraout_AL;
  TCGv_i64 arg1;
  TCGv_i64 arg2;
  TCGTemp *ts;
  
  s_00 = s->uc->tcg_ctx;
  _Var2 = sve_access_check_aarch64(s);
  if (_Var2) {
    iVar1 = a->ne;
    arg1 = read_cpu_reg_aarch64(s,a->rn,a->sf);
    arg2 = read_cpu_reg_aarch64(s,a->rm,a->sf);
    ts = tcg_temp_new_internal_aarch64(s_00,TCG_TYPE_I64,false);
    tcg_gen_setcond_i64_aarch64
              (s_00,TCG_COND_NE - (iVar1 == 0),(TCGv_i64)((long)ts - (long)s_00),arg1,arg2);
    tcg_gen_extrl_i64_i32_aarch64(s_00,s_00->cpu_NF,(TCGv_i64)((long)ts - (long)s_00));
    tcg_temp_free_internal_aarch64(s_00,ts);
    tcg_gen_xori_i32_aarch64(s_00,s_00->cpu_VF,s_00->cpu_NF,1);
    tcg_gen_andc_i32_aarch64(s_00,s_00->cpu_VF,s_00->cpu_VF,s_00->cpu_CF);
    tcg_gen_op2_aarch64(s_00,INDEX_op_neg_i32,(TCGArg)(s_00->cpu_NF + (long)s_00),
                        (TCGArg)(s_00->cpu_NF + (long)s_00));
    tcg_gen_op2_aarch64(s_00,INDEX_op_neg_i32,(TCGArg)(s_00->cpu_VF + (long)s_00),
                        (TCGArg)(s_00->cpu_VF + (long)s_00));
    return (_Bool)extraout_AL;
  }
  return _Var2;
}

Assistant:

static bool trans_CTERM(DisasContext *s, arg_CTERM *a)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    if (!sve_access_check(s)) {
        return true;
    }

    TCGCond cond = (a->ne ? TCG_COND_NE : TCG_COND_EQ);
    TCGv_i64 rn = read_cpu_reg(s, a->rn, a->sf);
    TCGv_i64 rm = read_cpu_reg(s, a->rm, a->sf);
    TCGv_i64 cmp = tcg_temp_new_i64(tcg_ctx);

    tcg_gen_setcond_i64(tcg_ctx, cond, cmp, rn, rm);
    tcg_gen_extrl_i64_i32(tcg_ctx, tcg_ctx->cpu_NF, cmp);
    tcg_temp_free_i64(tcg_ctx, cmp);

    /* VF = !NF & !CF.  */
    tcg_gen_xori_i32(tcg_ctx, tcg_ctx->cpu_VF, tcg_ctx->cpu_NF, 1);
    tcg_gen_andc_i32(tcg_ctx, tcg_ctx->cpu_VF, tcg_ctx->cpu_VF, tcg_ctx->cpu_CF);

    /* Both NF and VF actually look at bit 31.  */
    tcg_gen_neg_i32(tcg_ctx, tcg_ctx->cpu_NF, tcg_ctx->cpu_NF);
    tcg_gen_neg_i32(tcg_ctx, tcg_ctx->cpu_VF, tcg_ctx->cpu_VF);
    return true;
}